

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateRequiresImpl
          (Generator *this,GeneratorOptions *options,Printer *printer,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *required,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *forwards,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *provided,bool require_jspb,bool require_extension,bool require_map)

{
  iterator iVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  
  if (require_jspb) {
    io::Printer::Print(printer,
                       "goog.require(\'jspb.Message\');\ngoog.require(\'jspb.BinaryReader\');\ngoog.require(\'jspb.BinaryWriter\');\n"
                      );
  }
  if (require_extension) {
    io::Printer::Print(printer,"goog.require(\'jspb.ExtensionFieldBinaryInfo\');\n");
    io::Printer::Print(printer,"goog.require(\'jspb.ExtensionFieldInfo\');\n");
  }
  if (require_map) {
    io::Printer::Print(printer,"goog.require(\'jspb.Map\');\n");
  }
  p_Var2 = (required->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(required->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      iVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&provided->_M_t,(key_type *)(p_Var2 + 1));
      if ((_Rb_tree_header *)iVar1._M_node == &(provided->_M_t)._M_impl.super__Rb_tree_header) {
        io::Printer::Print(printer,"goog.require(\'$name$\');\n","name",(string *)(p_Var2 + 1));
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  io::Printer::Print(printer,"\n");
  p_Var2 = (forwards->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(forwards->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      iVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&provided->_M_t,(key_type *)(p_Var2 + 1));
      if ((_Rb_tree_header *)iVar1._M_node == &(provided->_M_t)._M_impl.super__Rb_tree_header) {
        io::Printer::Print(printer,"goog.forwardDeclare(\'$name$\');\n","name",
                           (string *)(p_Var2 + 1));
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return;
}

Assistant:

void Generator::GenerateRequiresImpl(const GeneratorOptions& options,
                                     io::Printer* printer,
                                     std::set<string>* required,
                                     std::set<string>* forwards,
                                     std::set<string>* provided,
                                     bool require_jspb, bool require_extension,
                                     bool require_map) const {
  if (require_jspb) {
    printer->Print(
        "goog.require('jspb.Message');\n"
        "goog.require('jspb.BinaryReader');\n"
        "goog.require('jspb.BinaryWriter');\n");
  }
  if (require_extension) {
    printer->Print("goog.require('jspb.ExtensionFieldBinaryInfo');\n");
    printer->Print(
        "goog.require('jspb.ExtensionFieldInfo');\n");
  }
  if (require_map) {
    printer->Print("goog.require('jspb.Map');\n");
  }

  std::set<string>::iterator it;
  for (it = required->begin(); it != required->end(); ++it) {
    if (provided->find(*it) != provided->end()) {
      continue;
    }
    printer->Print("goog.require('$name$');\n",
                   "name", *it);
  }

  printer->Print("\n");

  for (it = forwards->begin(); it != forwards->end(); ++it) {
    if (provided->find(*it) != provided->end()) {
      continue;
    }
    printer->Print("goog.forwardDeclare('$name$');\n",
                   "name", *it);
  }
}